

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * lua_setupvalue(lua_State *L,int funcindex,int n)

{
  uint uVar1;
  StkId pTVar2;
  undefined8 uVar3;
  GCObject *pGVar4;
  TValue *fi_00;
  TValue *io1;
  StkId fi;
  UpVal *uv;
  CClosure *owner;
  TValue *val;
  char *name;
  int n_local;
  int funcindex_local;
  lua_State *L_local;
  
  owner = (CClosure *)0x0;
  uv = (UpVal *)0x0;
  fi = (StkId)0x0;
  name._0_4_ = n;
  name._4_4_ = funcindex;
  _n_local = L;
  fi_00 = index2addr(L,funcindex);
  val = (TValue *)aux_upvalue(fi_00,(int)name,(TValue **)&owner,(CClosure **)&uv,(UpVal **)&fi);
  if (val != (TValue *)0x0) {
    _n_local->top = _n_local->top + -1;
    pTVar2 = _n_local->top;
    owner->next = (GCObject *)pTVar2->value_;
    uVar3 = *(undefined8 *)&pTVar2->tt_;
    owner->tt = (char)uVar3;
    owner->marked = (char)((ulong)uVar3 >> 8);
    owner->nupvalues = (char)((ulong)uVar3 >> 0x10);
    *(int5 *)&owner->field_0xb = (int5)((ulong)uVar3 >> 0x18);
    if (uv == (UpVal *)0x0) {
      if (((fi != (StkId)0x0) &&
          (pGVar4 = (fi->value_).gc, uVar1._0_1_ = pGVar4->tt, uVar1._1_1_ = pGVar4->marked,
          uVar1._2_2_ = *(undefined2 *)&pGVar4->field_0xa, (uVar1 & 0x40) != 0)) &&
         ((fi->value_).gc == (GCObject *)(fi + 1))) {
        luaC_upvalbarrier_(_n_local,(UpVal *)fi);
      }
    }
    else if ((((_n_local->top->tt_ & 0x40U) != 0) && ((uv->refcount & 0x400) != 0)) &&
            ((((_n_local->top->value_).gc)->marked & 3) != 0)) {
      luaC_barrier_(_n_local,(GCObject *)uv,(_n_local->top->value_).gc);
    }
  }
  return (char *)val;
}

Assistant:

LUA_API const char *lua_setupvalue (lua_State *L, int funcindex, int n) {
  const char *name;
  TValue *val = NULL;  /* to avoid warnings */
  GCObject *owner = NULL;  /* to avoid warnings */
  TValue *fi;
  lua_lock(L);
  fi = index2value(L, funcindex);
  api_checknelems(L, 1);
  name = aux_upvalue(fi, n, &val, &owner);
  if (name) {
    L->top--;
    setobj(L, val, s2v(L->top));
    luaC_barrier(L, owner, val);
  }
  lua_unlock(L);
  return name;
}